

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash_handler.c
# Opt level: O1

ion_err_t linear_hash_close_dictionary(ion_dictionary_t *dictionary)

{
  ion_err_t iVar1;
  
  iVar1 = linear_hash_close((linear_hash_table_t *)dictionary->instance);
  if (dictionary->instance != (ion_dictionary_parent_t *)0x0) {
    free(dictionary->instance);
    dictionary->instance = (ion_dictionary_parent_t *)0x0;
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_close_dictionary(
	ion_dictionary_t *dictionary
) {
	ion_err_t err = linear_hash_close((linear_hash_table_t *) dictionary->instance);

	if (dictionary->instance != NULL) {
		free(dictionary->instance);
		dictionary->instance = NULL;
	}

	if (err_ok != err) {
		return err;
	}

	return err_ok;
}